

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# virtual_mips.cpp
# Opt level: O2

void __thiscall vmips::Function::Function(Function *this,string *name,size_t argc)

{
  size_t sVar1;
  __shared_ptr<vmips::VirtReg,_(__gnu_cxx::_Lock_policy)2> _Stack_38;
  
  std::__cxx11::string::string((string *)this,(string *)name);
  this->count = 0;
  (this->ra_location).offset = 0;
  (this->ra_location).base.super___shared_ptr<vmips::VirtReg,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->ra_location).base.super___shared_ptr<vmips::VirtReg,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->pic_location).identifier = 0xffffffffffffffff;
  (this->pic_location).offset = 0;
  (this->pic_location).size = 0;
  (this->pic_location).status = Assigned;
  (this->pic_location).base.super___shared_ptr<vmips::VirtReg,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->pic_location).base.super___shared_ptr<vmips::VirtReg,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->s8_location).identifier = 0xffffffffffffffff;
  (this->s8_location).offset = 0;
  (this->s8_location).size = 0;
  (this->s8_location).status = Assigned;
  (this->s8_location).base.super___shared_ptr<vmips::VirtReg,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->s8_location).base.super___shared_ptr<vmips::VirtReg,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->data_blocks).
  super__Vector_base<std::shared_ptr<vmips::Data>,_std::allocator<std::shared_ptr<vmips::Data>_>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->data_blocks).
  super__Vector_base<std::shared_ptr<vmips::Data>,_std::allocator<std::shared_ptr<vmips::Data>_>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->data_blocks).
  super__Vector_base<std::shared_ptr<vmips::Data>,_std::allocator<std::shared_ptr<vmips::Data>_>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->mem_blocks).
  super__Vector_base<std::shared_ptr<vmips::MemoryLocation>,_std::allocator<std::shared_ptr<vmips::MemoryLocation>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->mem_blocks).
  super__Vector_base<std::shared_ptr<vmips::MemoryLocation>,_std::allocator<std::shared_ptr<vmips::MemoryLocation>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->mem_blocks).
  super__Vector_base<std::shared_ptr<vmips::MemoryLocation>,_std::allocator<std::shared_ptr<vmips::MemoryLocation>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->has_sub = false;
  this->allocated = false;
  this->sub_argc = 0;
  this->save_regs = 0;
  this->stack_size = 0;
  this->argc = argc;
  (this->cursor).super___shared_ptr<vmips::CFGNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->blocks).
  super__Vector_base<std::shared_ptr<vmips::CFGNode>,_std::allocator<std::shared_ptr<vmips::CFGNode>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->cursor).super___shared_ptr<vmips::CFGNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->blocks).
  super__Vector_base<std::shared_ptr<vmips::CFGNode>,_std::allocator<std::shared_ptr<vmips::CFGNode>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->blocks).
  super__Vector_base<std::shared_ptr<vmips::CFGNode>,_std::allocator<std::shared_ptr<vmips::CFGNode>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->ra_location).status = Undetermined;
  this->memory_count = 1;
  (this->ra_location).identifier = 0;
  (this->ra_location).size = 4;
  get_special((vmips *)&_Stack_38,sp);
  std::__shared_ptr<vmips::VirtReg,_(__gnu_cxx::_Lock_policy)2>::operator=
            (&(this->ra_location).base.
              super___shared_ptr<vmips::VirtReg,_(__gnu_cxx::_Lock_policy)2>,&_Stack_38);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_38._M_refcount);
  (this->pic_location).status = Undetermined;
  sVar1 = this->memory_count;
  this->memory_count = sVar1 + 1;
  (this->pic_location).identifier = sVar1;
  (this->pic_location).size = 4;
  get_special((vmips *)&_Stack_38,sp);
  std::__shared_ptr<vmips::VirtReg,_(__gnu_cxx::_Lock_policy)2>::operator=
            (&(this->pic_location).base.
              super___shared_ptr<vmips::VirtReg,_(__gnu_cxx::_Lock_policy)2>,&_Stack_38);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_38._M_refcount);
  (this->s8_location).status = Undetermined;
  sVar1 = this->memory_count;
  this->memory_count = sVar1 + 1;
  (this->s8_location).identifier = sVar1;
  (this->s8_location).size = 4;
  get_special((vmips *)&_Stack_38,sp);
  std::__shared_ptr<vmips::VirtReg,_(__gnu_cxx::_Lock_policy)2>::operator=
            (&(this->s8_location).base.
              super___shared_ptr<vmips::VirtReg,_(__gnu_cxx::_Lock_policy)2>,&_Stack_38);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_38._M_refcount);
  return;
}

Assistant:

Function::Function(std::string name, size_t argc) : name(std::move(name)), argc(argc) {
    ra_location.status = MemoryLocation::Undetermined;
    ra_location.identifier = memory_count++;
    ra_location.size = 4;
    ra_location.base = get_special(SpecialReg::sp);

    pic_location.status = MemoryLocation::Undetermined;
    pic_location.identifier = memory_count++;
    pic_location.size = 4;
    pic_location.base = get_special(SpecialReg::sp);

    s8_location.status = MemoryLocation::Undetermined;
    s8_location.identifier = memory_count++;
    s8_location.size = 4;
    s8_location.base = get_special(SpecialReg::sp);
}